

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.c
# Opt level: O0

int main(void)

{
  int iVar1;
  GLFWwindow *pGVar2;
  bool bVar3;
  double dVar4;
  double t;
  int i_1;
  GLboolean running;
  int i;
  
  bVar3 = true;
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  i_1 = 0;
  while( true ) {
    if (1 < i_1) {
      activeWindow = windows[0];
      key_callback((GLFWwindow *)0x0,0x48,0,1,0);
      while (bVar3) {
        if (delay != 0) {
          dVar4 = glfwGetTime();
          for (t._0_4_ = 0; t._0_4_ < CommandCount; t._0_4_ = t._0_4_ + 1) {
            if (((commands[t._0_4_].time != 0.0) || (NAN(commands[t._0_4_].time))) &&
               (3.0 <= dVar4 - commands[t._0_4_].time)) {
              command_callback(commands[t._0_4_].key);
              commands[t._0_4_].time = 0.0;
            }
          }
        }
        iVar1 = glfwWindowShouldClose(windows[0]);
        bVar3 = true;
        if (iVar1 == 0) {
          iVar1 = glfwWindowShouldClose(windows[1]);
          bVar3 = iVar1 != 0;
        }
        bVar3 = (bool)(bVar3 ^ 1);
        glfwPollEvents();
      }
      glfwTerminate();
      exit(0);
    }
    pGVar2 = glfwCreateWindow(W,H,"Cursor testing",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    windows[i_1] = pGVar2;
    if (windows[i_1] == (GLFWwindow *)0x0) break;
    glfwSetWindowPos(windows[i_1],(i_1 & 1U) * (W + 0x32) + 100,100);
    glfwSetWindowRefreshCallback(windows[i_1],refresh_callback);
    glfwSetFramebufferSizeCallback(windows[i_1],framebuffer_size_callback);
    glfwSetKeyCallback(windows[i_1],key_callback);
    glfwSetWindowFocusCallback(windows[i_1],focus_callback);
    glfwMakeContextCurrent(windows[i_1]);
    glClear(0x4000);
    glfwSwapBuffers(windows[i_1]);
    i_1 = i_1 + 1;
  }
  glfwTerminate();
  exit(1);
}

Assistant:

int main(void)
{
    int i;
    GLboolean running = GL_TRUE;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    for (i = 0; i < 2; i++)
    {
        windows[i] = glfwCreateWindow(W, H, "Cursor testing", NULL, NULL);

        if (!windows[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwSetWindowPos(windows[i], 100 + (i & 1) * (W + 50), 100);

        glfwSetWindowRefreshCallback(windows[i], refresh_callback);
        glfwSetFramebufferSizeCallback(windows[i], framebuffer_size_callback);
        glfwSetKeyCallback(windows[i], key_callback);
        glfwSetWindowFocusCallback(windows[i], focus_callback);

        glfwMakeContextCurrent(windows[i]);
        glClear(GL_COLOR_BUFFER_BIT);
        glfwSwapBuffers(windows[i]);
    }

    activeWindow = windows[0];

    key_callback(NULL, GLFW_KEY_H, 0, GLFW_PRESS, 0);

    while (running)
    {
        if (delay)
        {
            int i;
            double t = glfwGetTime();

            for (i = 0; i < CommandCount; i++)
            {
                if (commands[i].time != 0 && t - commands[i].time >= 3.0)
                {
                    command_callback(commands[i].key);
                    commands[i].time = 0;
                }
            }
        }

        running = !(glfwWindowShouldClose(windows[0]) || glfwWindowShouldClose(windows[1]));

        glfwPollEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}